

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

bool jsonip::parse<A>(A *t,char *str,size_t size)

{
  bool bVar1;
  undefined1 local_b8 [8];
  state st;
  undefined1 local_70 [8];
  Reader reader;
  holder local_50;
  state_t local_48;
  undefined1 local_38 [8];
  semantic_state ss;
  size_t size_local;
  char *str_local;
  A *t_local;
  
  ss.state.
  super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)size;
  holder::holder<A>(&local_50,t);
  reader.len_ = (size_t)detail::get_helper<A>(t);
  std::make_pair<jsonip::holder,jsonip::helper_const*>(&local_48.first,(helper **)&local_50);
  semantic_state::semantic_state((semantic_state *)local_38,&local_48);
  parser::Reader::Reader
            ((Reader *)local_70,str,
             (size_t)ss.state.
                     super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)local_b8,
             (semantic_state *)local_38,(Reader *)local_70);
  bVar1 = parser::
          or_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                    ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)local_b8);
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::~ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)local_b8);
  semantic_state::~semantic_state((semantic_state *)local_38);
  return bVar1;
}

Assistant:

bool parse(T& t, const char* str, size_t size)
    {
        typedef parser::ReaderState<semantic_state, parser::Reader> state;
        semantic_state ss(std::make_pair(holder(&t), detail::get_helper(t)));
        parser::Reader reader(str, size);
        state st(ss, reader);

        return jsonip::grammar::gram::match(st);
    }